

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydata.cpp
# Opt level: O0

CalculateGrowingBlockSizeResult
calculateBlockSize(qsizetype capacity,qsizetype objectSize,qsizetype headerSize,
                  AllocationOption option)

{
  qsizetype qVar1;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  qsizetype in_RDI;
  CalculateGrowingBlockSizeResult CVar2;
  qsizetype FooterSize;
  undefined4 in_stack_ffffffffffffffd0;
  undefined1 in_stack_fffffffffffffff0 [16];
  
  if (in_RSI < 3) {
    in_RDX = in_RDX + 2;
  }
  if (in_ECX == 0) {
    CVar2 = qCalculateGrowingBlockSize
                      (in_stack_fffffffffffffff0._8_8_,in_stack_fffffffffffffff0._0_8_,in_RDI);
  }
  else {
    qVar1 = qCalculateBlockSize(in_RDX,CONCAT44(in_ECX,in_stack_ffffffffffffffd0),2);
    CVar2.elementCount = in_RDI;
    CVar2.size = qVar1;
  }
  return CVar2;
}

Assistant:

static inline CalculateGrowingBlockSizeResult
calculateBlockSize(qsizetype capacity, qsizetype objectSize, qsizetype headerSize, QArrayData::AllocationOption option)
{
    // Adjust the header size up to account for the trailing null for QString
    // and QByteArray. This is not checked for overflow because headers sizes
    // should not be anywhere near the overflow limit.
    constexpr qsizetype FooterSize = qMax(sizeof(QString::value_type), sizeof(QByteArray::value_type));
    if (objectSize <= FooterSize)
        headerSize += FooterSize;

    // allocSize = objectSize * capacity + headerSize, but checked for overflow
    // plus padded to grow in size
    if (option == QArrayData::Grow) {
        return qCalculateGrowingBlockSize(capacity, objectSize, headerSize);
    } else {
        return { qCalculateBlockSize(capacity, objectSize, headerSize), capacity };
    }
}